

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O2

boolean snuff_lit(obj *obj)

{
  boolean bVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char *pcVar3;
  xchar y;
  xchar x;
  
  _y = (undefined2)((ulong)in_RAX >> 0x30);
  if ((obj->field_0x4c & 8) == 0) {
    return '\0';
  }
  if ((2 < (ushort)obj->otyp - 0xe7) && (obj->otyp != 0x142)) {
    bVar1 = snuff_candle(obj);
    if (bVar1 == '\0') {
      return '\0';
    }
    return '\x01';
  }
  get_obj_location(obj,&x,&y,0);
  if (obj->where == '\x04') {
    if ((viz_array[y][x] & 2U) == 0) goto LAB_00140e68;
  }
  else {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_00140e3a;
        goto LAB_00140dfa;
      }
    }
    else {
LAB_00140dfa:
      if (ublindf == (obj *)0x0) goto LAB_00140e68;
    }
    if (ublindf->oartifact != '\x1d') goto LAB_00140e68;
  }
LAB_00140e3a:
  pcVar2 = Yname2(obj);
  pcVar3 = otense(obj,"go");
  pline("%s %s out!",pcVar2,pcVar3);
LAB_00140e68:
  end_burn(obj,'\x01');
  return '\x01';
}

Assistant:

boolean snuff_lit(struct obj *obj)
{
	xchar x, y;

	if (obj->lamplit) {
	    if (obj->otyp == OIL_LAMP || obj->otyp == MAGIC_LAMP ||
		    obj->otyp == BRASS_LANTERN || obj->otyp == POT_OIL) {
		get_obj_location(obj, &x, &y, 0);
		if (obj->where == OBJ_MINVENT ? cansee(x,y) : !Blind)
		    pline("%s %s out!", Yname2(obj), otense(obj, "go"));
		end_burn(obj, TRUE);
		return TRUE;
	    }
	    if (snuff_candle(obj)) return TRUE;
	}
	return FALSE;
}